

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_cfg.cpp
# Opt level: O2

MPP_RET mpp_enc_cfg_get_ptr(MppEncCfg cfg,char *name,void **val)

{
  MPP_RET MVar1;
  MppEncCfgService *this;
  MppTrieInfo *pMVar2;
  char *pcVar3;
  MppTrieInfo *pMVar4;
  MppCfgInfo *node;
  
  if (cfg == (MppEncCfg)0x0 || name == (char *)0x0) {
    _mpp_log_l(2,"mpp_enc_cfg","invalid input cfg %p name %p\n","mpp_enc_cfg_get_ptr",cfg,name);
    MVar1 = MPP_ERR_NULL_PTR;
  }
  else {
    this = MppEncCfgService::get();
    pMVar2 = MppEncCfgService::get_info(this,name);
    if (pMVar2 == (MppTrieInfo *)0x0) {
      node = (MppCfgInfo *)0x0;
    }
    else {
      node = (MppCfgInfo *)(&pMVar2[1].field_0x0 + (byte)pMVar2->field_0x3);
    }
    MVar1 = check_cfg_info(node,name,CFG_FUNC_TYPE_Ptr,"mpp_enc_cfg_get_ptr");
    if (MVar1 == MPP_OK) {
      if (((byte)mpp_enc_cfg_debug & 4) != 0) {
        pMVar4 = pMVar2 + 1;
        if (pMVar2 == (MppTrieInfo *)0x0) {
          pMVar4 = (MppTrieInfo *)0x0;
        }
        pcVar3 = strof_cfg_type(node->data_type);
        _mpp_log_l(4,"mpp_enc_cfg","name %s type %s\n","mpp_enc_cfg_get_ptr",pMVar4,pcVar3);
      }
      MVar1 = mpp_cfg_get_ptr(node,(void *)((long)cfg + 8),val);
      return MVar1;
    }
    MVar1 = MPP_NOK;
  }
  return MVar1;
}

Assistant:

void mpp_enc_cfg_show(void)
{
    MppEncCfgService *srv = MppEncCfgService::get();
    MppTrieInfo *root = srv->get_info_first();

    mpp_log("dumping valid configure string start\n");

    if (root) {
        MppTrieInfo *node = root;

        do {
            if (node->ctx_len == sizeof(MppCfgInfo)) {
                MppCfgInfo *info = (MppCfgInfo *)mpp_trie_info_ctx(node);

                mpp_log("%-25s type %s - %d:%d\n", mpp_trie_info_name(node),
                        strof_cfg_type(info->data_type), info->data_offset, info->data_size);
            } else {
                mpp_log("%-25s size - %d\n", mpp_trie_info_name(node), node->ctx_len);
            }

            node = srv->get_info_next(node);
            if (!node)
                break;
        } while (1);
    }
    mpp_log("dumping valid configure string done\n");

    mpp_log("total cfg count %d with %d node size %d\n",
            srv->get_info_count(), srv->get_node_count(), srv->get_info_size());
}